

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btRigidBody.cpp
# Opt level: O0

btVector3 __thiscall btRigidBody::getLocalInertia(btRigidBody *this)

{
  btScalar *pbVar1;
  long in_RDI;
  btVector3 inertia;
  btVector3 inertiaLocal;
  float local_4c;
  float local_48;
  float local_44;
  float local_34;
  float local_30;
  float local_2c;
  btVector3 local_28;
  btVector3 local_10;
  
  btVector3::btVector3(&local_10);
  local_28.m_floats._0_8_ = *(undefined8 *)(in_RDI + 0x1d0);
  local_28.m_floats._8_8_ = *(undefined8 *)(in_RDI + 0x1d8);
  pbVar1 = btVector3::x(&local_28);
  if ((*pbVar1 != 0.0) || (NAN(*pbVar1))) {
    pbVar1 = btVector3::x(&local_28);
    local_44 = 1.0 / *pbVar1;
  }
  else {
    local_44 = 0.0;
  }
  local_2c = local_44;
  pbVar1 = btVector3::y(&local_28);
  if ((*pbVar1 != 0.0) || (NAN(*pbVar1))) {
    pbVar1 = btVector3::y(&local_28);
    local_48 = 1.0 / *pbVar1;
  }
  else {
    local_48 = 0.0;
  }
  local_30 = local_48;
  pbVar1 = btVector3::z(&local_28);
  if ((*pbVar1 != 0.0) || (NAN(*pbVar1))) {
    pbVar1 = btVector3::z(&local_28);
    local_4c = 1.0 / *pbVar1;
  }
  else {
    local_4c = 0.0;
  }
  local_34 = local_4c;
  btVector3::setValue(&local_10,&local_2c,&local_30,&local_34);
  return (btVector3)local_10.m_floats;
}

Assistant:

btVector3 btRigidBody::getLocalInertia() const
{

	btVector3 inertiaLocal;
	const btVector3 inertia = m_invInertiaLocal;
	inertiaLocal.setValue(inertia.x() != btScalar(0.0) ? btScalar(1.0) / inertia.x() : btScalar(0.0),
		inertia.y() != btScalar(0.0) ? btScalar(1.0) / inertia.y() : btScalar(0.0),
		inertia.z() != btScalar(0.0) ? btScalar(1.0) / inertia.z() : btScalar(0.0));
	return inertiaLocal;
}